

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,int,double,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool,false,false>
               (double *ldata,int *rdata,double *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = 0;
      do {
        dVar10 = ldata[iVar3];
        dVar9 = (double)rdata[iVar3];
        if (rdata[iVar3] < 0) {
          dVar9 = pow(10.0,-dVar9);
          dVar8 = round(dVar10 / dVar9);
          dVar8 = dVar8 * dVar9;
          dVar10 = 0.0;
        }
        else {
          dVar9 = pow(10.0,dVar9);
          dVar8 = round(dVar10 * dVar9);
          dVar8 = dVar8 / dVar9;
        }
        if ((ulong)ABS(dVar8) < 0x7ff0000000000000) {
          dVar10 = dVar8;
        }
        result_data[iVar3] = dVar10;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar2 = 0;
    uVar5 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar4 = 0xffffffffffffffff;
      }
      else {
        uVar4 = puVar1[uVar2];
      }
      uVar6 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar6 = count;
      }
      uVar7 = uVar6;
      if (uVar4 != 0) {
        uVar7 = uVar5;
        if (uVar4 == 0xffffffffffffffff) {
          if (uVar5 < uVar6) {
            do {
              dVar10 = ldata[uVar5];
              dVar9 = (double)rdata[uVar5];
              if (rdata[uVar5] < 0) {
                dVar9 = pow(10.0,-dVar9);
                dVar8 = round(dVar10 / dVar9);
                dVar8 = dVar8 * dVar9;
                dVar10 = 0.0;
              }
              else {
                dVar9 = pow(10.0,dVar9);
                dVar8 = round(dVar10 * dVar9);
                dVar8 = dVar8 / dVar9;
              }
              if ((ulong)ABS(dVar8) < 0x7ff0000000000000) {
                dVar10 = dVar8;
              }
              result_data[uVar5] = dVar10;
              uVar5 = uVar5 + 1;
              uVar7 = uVar5;
            } while (uVar6 != uVar5);
          }
        }
        else if (uVar5 < uVar6) {
          uVar7 = 0;
          do {
            if ((uVar4 >> (uVar7 & 0x3f) & 1) != 0) {
              dVar10 = ldata[uVar5 + uVar7];
              dVar9 = (double)rdata[uVar5 + uVar7];
              if (rdata[uVar5 + uVar7] < 0) {
                dVar9 = pow(10.0,-dVar9);
                dVar8 = round(dVar10 / dVar9);
                dVar8 = dVar8 * dVar9;
                dVar10 = 0.0;
              }
              else {
                dVar9 = pow(10.0,dVar9);
                dVar8 = round(dVar10 * dVar9);
                dVar8 = dVar8 / dVar9;
              }
              if ((ulong)ABS(dVar8) < 0x7ff0000000000000) {
                dVar10 = dVar8;
              }
              result_data[uVar5 + uVar7] = dVar10;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar5 - uVar6) + uVar7 != 0);
          uVar7 = uVar5 + uVar7;
        }
      }
      uVar2 = uVar2 + 1;
      uVar5 = uVar7;
    } while (uVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}